

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::PotentialEnergyObjectiveFunction::setInitialCoords
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          PotentialEnergyObjectiveFunction *this)

{
  int *piVar1;
  int *piVar2;
  pointer piVar3;
  pointer ppSVar4;
  pointer ppAVar5;
  int iVar6;
  Molecule *pMVar7;
  ulong uVar8;
  int iproc;
  long lVar9;
  pointer ppAVar10;
  int iVar11;
  ulong uVar12;
  pointer pdVar13;
  pointer ppSVar14;
  Atom *pAVar15;
  StuntDouble *pSVar16;
  MoleculeIterator i;
  allocator_type local_99;
  DynamicVector<double,_std::allocator<double>_> *local_98;
  Vector3d pos;
  Vector3d eulerAngle;
  vector<int,_std::allocator<int>_> onProc;
  Vector<double,_3U> local_48;
  
  piVar1 = &this->nproc_;
  local_98 = __return_storage_ptr__;
  MPI_Comm_size(&ompi_mpi_comm_world,piVar1);
  MPI_Comm_rank(&ompi_mpi_comm_world,&this->myrank_);
  pos.super_Vector<double,_3U>.data_[0]._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&onProc,(long)this->nproc_,(value_type_conflict2 *)&pos,(allocator_type *)&eulerAngle);
  piVar3 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  pos.super_Vector<double,_3U>.data_[0]._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->displacements_,(long)*piVar1,(value_type_conflict2 *)&pos);
  i._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&pos.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&eulerAngle.super_Vector<double,_3U>);
  this->ndf_ = 0;
  pMVar7 = SimInfo::beginMolecule(this->info_,&i);
  piVar2 = &this->ndf_;
  while (pMVar7 != (Molecule *)0x0) {
    ppSVar14 = (pMVar7->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar4 = (pMVar7->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar14 == ppSVar4) {
      pSVar16 = (StuntDouble *)0x0;
    }
    else {
      pSVar16 = *ppSVar14;
    }
    iVar11 = *piVar2;
    while (ppSVar14 = ppSVar14 + 1, pSVar16 != (StuntDouble *)0x0) {
      *piVar2 = iVar11 + 3;
      iVar6 = iVar11 + 3;
      if (pSVar16->objType_ - otDAtom < 2) {
        *piVar2 = iVar11 + 6;
        iVar6 = iVar11 + 6;
      }
      iVar11 = iVar6;
      if (ppSVar14 == ppSVar4) {
        pSVar16 = (StuntDouble *)0x0;
      }
      else {
        pSVar16 = *ppSVar14;
      }
    }
    pMVar7 = SimInfo::nextMolecule(this->info_,&i);
  }
  if (this->hasFlucQ_ == true) {
    pMVar7 = SimInfo::beginMolecule(this->info_,&i);
    while (pMVar7 != (Molecule *)0x0) {
      ppAVar10 = (pMVar7->fluctuatingCharges_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar5 = (pMVar7->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar10 == ppAVar5) {
        pAVar15 = (Atom *)0x0;
      }
      else {
        pAVar15 = *ppAVar10;
      }
      iVar11 = *piVar2;
      while( true ) {
        iVar11 = iVar11 + 1;
        ppAVar10 = ppAVar10 + 1;
        if (pAVar15 == (Atom *)0x0) break;
        *piVar2 = iVar11;
        if (ppAVar10 == ppAVar5) {
          pAVar15 = (Atom *)0x0;
        }
        else {
          pAVar15 = *ppAVar10;
        }
      }
      pMVar7 = SimInfo::nextMolecule(this->info_,&i);
    }
  }
  MPI_Allgather(piVar2,1,&ompi_mpi_int,
                onProc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start,1,&ompi_mpi_int,&ompi_mpi_comm_world);
  *piVar2 = 0;
  uVar12 = 0;
  uVar8 = (ulong)(uint)*piVar1;
  if (*piVar1 < 1) {
    uVar8 = uVar12;
  }
  iVar11 = 0;
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    iVar11 = iVar11 + onProc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12];
    *piVar2 = iVar11;
  }
  piVar3 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar3 = 0;
  iVar11 = 0;
  for (lVar9 = 1; lVar9 < *piVar1; lVar9 = lVar9 + 1) {
    iVar11 = iVar11 + onProc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9 + -1];
    piVar3[lVar9] = iVar11;
  }
  local_48.data_[0] = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98->data_,(long)*piVar2,local_48.data_,&local_99);
  iVar11 = (this->displacements_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[this->myrank_];
  pMVar7 = SimInfo::beginMolecule(this->info_,&i);
  while (pMVar7 != (Molecule *)0x0) {
    ppSVar14 = (pMVar7->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar14 !=
        (pMVar7->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00145ae3;
    pSVar16 = (StuntDouble *)0x0;
    while (pSVar16 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_48,pSVar16);
      Vector<double,_3U>::operator=(&pos.super_Vector<double,_3U>,&local_48);
      pdVar13 = (local_98->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar13[iVar11] =
           (double)CONCAT44(pos.super_Vector<double,_3U>.data_[0]._4_4_,
                            pos.super_Vector<double,_3U>.data_[0]._0_4_);
      pdVar13[(long)iVar11 + 1] = pos.super_Vector<double,_3U>.data_[1];
      pdVar13[(long)iVar11 + 2] = pos.super_Vector<double,_3U>.data_[2];
      iVar6 = iVar11 + 3;
      if (pSVar16->objType_ - otDAtom < 2) {
        StuntDouble::getEuler((Vector3d *)&local_48,pSVar16);
        Vector<double,_3U>::operator=(&eulerAngle.super_Vector<double,_3U>,&local_48);
        pdVar13 = (local_98->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13[iVar11 + 3] = eulerAngle.super_Vector<double,_3U>.data_[0];
        pdVar13[(long)iVar11 + 4] = eulerAngle.super_Vector<double,_3U>.data_[1];
        pdVar13[(long)iVar11 + 5] = eulerAngle.super_Vector<double,_3U>.data_[2];
        iVar6 = iVar11 + 6;
      }
      iVar11 = iVar6;
      ppSVar14 = ppSVar14 + 1;
      pSVar16 = (StuntDouble *)0x0;
      if (ppSVar14 !=
          (pMVar7->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00145ae3:
        pSVar16 = *ppSVar14;
      }
    }
    pMVar7 = SimInfo::nextMolecule(this->info_,&i);
  }
  if (this->hasFlucQ_ == true) {
    pMVar7 = SimInfo::beginMolecule(this->info_,&i);
    while (pMVar7 != (Molecule *)0x0) {
      ppAVar10 = (pMVar7->fluctuatingCharges_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar5 = (pMVar7->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar10 == ppAVar5) {
        pAVar15 = (Atom *)0x0;
      }
      else {
        pAVar15 = *ppAVar10;
      }
      pdVar13 = (local_98->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + iVar11;
      while (ppAVar10 = ppAVar10 + 1, pAVar15 != (Atom *)0x0) {
        *pdVar13 = *(double *)
                    (*(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQPos.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar15->super_StuntDouble).storage_) +
                    (long)(pAVar15->super_StuntDouble).localIndex_ * 8);
        if (ppAVar10 == ppAVar5) {
          pAVar15 = (Atom *)0x0;
        }
        else {
          pAVar15 = *ppAVar10;
        }
        iVar11 = iVar11 + 1;
        pdVar13 = pdVar13 + 1;
      }
      pMVar7 = SimInfo::nextMolecule(this->info_,&i);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&onProc.super__Vector_base<int,_std::allocator<int>_>);
  return local_98;
}

Assistant:

DynamicVector<RealType> PotentialEnergyObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> onProc(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule::AtomIterator ai;
    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    Vector3d pos;
    Vector3d eulerAngle;

    ndf_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_ += 3;

        if (sd->isDirectional()) { ndf_ += 3; }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          ndf_++;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&ndf_, 1, MPI_INT, &onProc[0], 1, MPI_INT, MPI_COMM_WORLD);

    ndf_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      ndf_ += onProc[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] = displacements_[iproc - 1] + onProc[iproc - 1];
    }
#endif

    DynamicVector<RealType> xinit(ndf_, 0.0);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos            = sd->getPos();
        xinit[index++] = pos[0];
        xinit[index++] = pos[1];
        xinit[index++] = pos[2];

        if (sd->isDirectional()) {
          eulerAngle     = sd->getEuler();
          xinit[index++] = eulerAngle[0];
          xinit[index++] = eulerAngle[1];
          xinit[index++] = eulerAngle[2];
        }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          xinit[index++] = atom->getFlucQPos();
        }
      }
    }

    return xinit;
  }